

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Organya.cpp
# Opt level: O3

BOOL __thiscall OrgData::SetMusicInfo(OrgData *this,MUSICINFO *mi,unsigned_long flag)

{
  long lVar1;
  
  if ((flag & 2) != 0) {
    (this->info).dot = mi->dot;
    (this->info).line = mi->line;
  }
  if ((flag & 1) != 0) {
    (this->info).wait = mi->wait;
  }
  if ((flag & 8) != 0) {
    lVar1 = mi->end_x;
    (this->info).repeat_x = mi->repeat_x;
    (this->info).end_x = lVar1;
  }
  if ((flag & 0x10) != 0) {
    lVar1 = 0x18;
    do {
      *(undefined2 *)((long)&((MUSICINFO *)((this->info).tdata + -1))->wait + lVar1) =
           *(undefined2 *)((long)&((MUSICINFO *)(mi->tdata + -1))->wait + lVar1);
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0xd8);
  }
  if ((flag & 0x20) != 0) {
    lVar1 = 0x1a;
    do {
      *(undefined1 *)((long)&((MUSICINFO *)((this->info).tdata + -1))->wait + lVar1) =
           *(undefined1 *)((long)&((MUSICINFO *)(mi->tdata + -1))->wait + lVar1);
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0x19a);
  }
  if ((flag & 0x40) != 0) {
    lVar1 = 0x1b;
    do {
      *(undefined1 *)((long)&((MUSICINFO *)((this->info).tdata + -1))->wait + lVar1) =
           *(undefined1 *)((long)&((MUSICINFO *)(mi->tdata + -1))->wait + lVar1);
      lVar1 = lVar1 + 0x18;
    } while (lVar1 != 0x19b);
  }
  return true;
}

Assistant:

BOOL OrgData::SetMusicInfo(MUSICINFO *mi, unsigned long flag)
{
	int i;

	if (flag & SETGRID)	// グリッドを有効に (Enable grid)
	{
		info.dot = mi->dot;
		info.line = mi->line;
	}

	if (flag & SETWAIT)
	{
		info.wait = mi->wait;
	}

	if (flag & SETREPEAT)
	{
		info.repeat_x = mi->repeat_x;
		info.end_x = mi->end_x;
	}

	if (flag & SETFREQ)
	{
		for (i = 0; i < MAXMELODY; i++)
		{
			info.tdata[i].freq = mi->tdata[i].freq;
			info.tdata[i].pipi = info.tdata[i].pipi;	 // Just sets info.tdata[i].pipi to itself (SETPIPI already sets pipi, so maybe this line shouldn't be here in the first place)
		}
	}

	if (flag & SETWAVE)
		for (i = 0; i < MAXTRACK; i++)
			info.tdata[i].wave_no = mi->tdata[i].wave_no;

	if (flag & SETPIPI)
		for (i = 0; i < MAXTRACK; i++)
			info.tdata[i].pipi = mi->tdata[i].pipi;

	return TRUE;
}